

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  uint *puVar1;
  float *pfVar2;
  float fVar3;
  float y0;
  ImVec2 IVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  int iVar8;
  uchar *puVar9;
  long lVar10;
  ImFont *pIVar11;
  undefined1 auVar12 [16];
  int iVar13;
  ImFontAtlasCustomRect *pIVar14;
  ulong uVar15;
  uint uVar16;
  uint *puVar17;
  uint uVar18;
  int iVar19;
  size_t __n;
  int iVar20;
  long lVar21;
  long lVar22;
  uint uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 in_ZMM5 [64];
  size_t local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ImFontAtlas *local_48;
  ulong local_40;
  ulong local_38;
  
  if ((atlas->TexPixelsAlpha8 == (uchar *)0x0) && (atlas->TexPixelsRGBA32 == (uint *)0x0)) {
    __assert_fail("atlas->TexPixelsAlpha8 != __null || atlas->TexPixelsRGBA32 != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                  ,0xa1d,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
  }
  pIVar14 = ImFontAtlas::GetCustomRectByIndex(atlas,atlas->PackIdMouseCursors);
  uVar5 = pIVar14->X;
  if (uVar5 == 0xffff) {
    __assert_fail("r->IsPacked()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                  ,0x9ac,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
  }
  local_48 = atlas;
  if ((atlas->Flags & 2) == 0) {
    if ((pIVar14->Width != 0xd9) || (pIVar14->Height != 0x1b)) {
      __assert_fail("r->Width == FONT_ATLAS_DEFAULT_TEX_DATA_W * 2 + 1 && r->Height == FONT_ATLAS_DEFAULT_TEX_DATA_H"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                    ,0x9b2,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
    }
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      ImFontAtlasBuildRender32bppRectFromString
                (atlas,(uint)uVar5,(uint)pIVar14->Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'.',0xffffffff);
      ImFontAtlasBuildRender32bppRectFromString
                (atlas,uVar5 + 0x6d,(uint)pIVar14->Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'X',0xffffffff);
    }
    else {
      ImFontAtlasBuildRender8bppRectFromString
                (atlas,(uint)uVar5,(uint)pIVar14->Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'.',0xff);
      ImFontAtlasBuildRender8bppRectFromString
                (atlas,uVar5 + 0x6d,(uint)pIVar14->Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'X',0xff);
    }
  }
  else {
    if ((pIVar14->Width != 2) || (pIVar14->Height != 2)) {
      __assert_fail("r->Width == 2 && r->Height == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                    ,0x9c3,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
    }
    iVar20 = atlas->TexWidth;
    iVar13 = (uint)pIVar14->Y * iVar20 + (uint)uVar5;
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      puVar17 = atlas->TexPixelsRGBA32;
      puVar1 = puVar17 + (iVar20 + iVar13);
      puVar1[0] = 0xffffffff;
      puVar1[1] = 0xffffffff;
      puVar17 = puVar17 + iVar13;
      puVar17[0] = 0xffffffff;
      puVar17[1] = 0xffffffff;
    }
    else {
      atlas->TexPixelsAlpha8[(long)(iVar20 + iVar13) + 1] = 0xff;
      atlas->TexPixelsAlpha8[iVar20 + iVar13] = 0xff;
      atlas->TexPixelsAlpha8[(long)iVar13 + 1] = 0xff;
      atlas->TexPixelsAlpha8[iVar13] = 0xff;
    }
  }
  uVar16._0_2_ = pIVar14->X;
  uVar16._2_2_ = pIVar14->Y;
  auVar12 = vpmovzxwd_avx(ZEXT416(uVar16));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar24._0_4_ = (atlas->TexUvScale).x * (auVar12._0_4_ + 0.5);
  auVar24._4_4_ = (atlas->TexUvScale).y * (auVar12._4_4_ + 0.5);
  auVar24._8_4_ = (auVar12._8_4_ + 0.5) * 0.0;
  auVar24._12_4_ = (auVar12._12_4_ + 0.5) * 0.0;
  IVar4 = (ImVec2)vmovlps_avx(auVar24);
  atlas->TexUvWhitePixel = IVar4;
  if ((atlas->Flags & 4) == 0) {
    pIVar14 = ImFontAtlas::GetCustomRectByIndex(atlas,atlas->PackIdLines);
    if (pIVar14->X == 0xffff) {
      __assert_fail("r->IsPacked()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                    ,0x9d8,"void ImFontAtlasBuildRenderLinesTexData(ImFontAtlas *)");
    }
    local_60 = 0;
    lVar22 = -0x40;
    iVar20 = 0;
    uVar15 = 0;
    do {
      if ((ulong)pIVar14->Height <= lVar22 + 0x40U) {
        __assert_fail("pad_left + line_width + pad_right == r->Width && y < r->Height",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                      ,0x9e2,"void ImFontAtlasBuildRenderLinesTexData(ImFontAtlas *)");
      }
      uVar5 = pIVar14->Width;
      uVar16 = (int)uVar15 + (uint)uVar5;
      uVar23 = uVar16 >> 1;
      iVar13 = (int)lVar22;
      uVar18 = iVar13 + uVar23 + 0x40;
      iVar19 = (uVar5 - uVar23) + (int)uVar15;
      puVar9 = atlas->TexPixelsAlpha8;
      local_38 = uVar15;
      if (puVar9 == (uchar *)0x0) {
        puVar17 = atlas->TexPixelsRGBA32;
        uVar6 = pIVar14->X;
        uVar7 = pIVar14->Y;
        iVar8 = atlas->TexWidth;
        puVar1 = puVar17 + ((iVar13 + (uint)uVar7 + 0x40) * iVar8 + (uint)uVar6);
        if (1 < uVar16) {
          memset(puVar1,0,(ulong)(uVar23 + (uVar23 == 0)) << 2);
        }
        if (lVar22 != -0x40) {
          memset(puVar1 + uVar23,0xff,local_60);
        }
        if (uVar18 != uVar5) {
          puVar17 = puVar17 + (ulong)(iVar8 * ((uint)uVar7 + iVar20) + (uint)uVar6) +
                              (ulong)uVar23 + lVar22 + 0x40;
          __n = (ulong)(iVar19 + (uint)(iVar19 == 0)) << 2;
          goto LAB_00191e9d;
        }
      }
      else {
        uVar6 = pIVar14->X;
        uVar7 = pIVar14->Y;
        local_40 = (ulong)uVar7;
        iVar8 = atlas->TexWidth;
        if (1 < uVar16) {
          memset(puVar9 + ((iVar13 + (uint)uVar7 + 0x40) * iVar8 + (uint)uVar6),0,
                 (ulong)(uVar23 + (uVar23 == 0)));
        }
        if (lVar22 != -0x40) {
          memset(puVar9 + ((iVar13 + (uint)uVar7 + 0x40) * iVar8 + (uint)uVar6) + uVar23,0xff,
                 lVar22 + 0x40U);
        }
        if (uVar18 != uVar5) {
          puVar17 = (uint *)(puVar9 + lVar22 + (ulong)(iVar8 * ((int)local_40 + iVar20) +
                                                      (uint)uVar6) + (ulong)uVar23 + 0x40);
          __n = (size_t)(iVar19 + (uint)(iVar19 == 0));
LAB_00191e9d:
          memset(puVar17,0,__n);
        }
      }
      auVar25._0_4_ = (float)((uVar23 + pIVar14->X) - 1);
      auVar25._4_12_ = in_ZMM5._4_12_;
      auVar26._0_4_ = (float)(iVar13 + uVar23 + pIVar14->X + 0x41);
      auVar26._4_12_ = in_ZMM5._4_12_;
      fVar3 = (local_48->TexUvScale).y;
      auVar12 = vinsertps_avx(ZEXT416((uint)(local_48->TexUvScale).x),
                              ZEXT416((uint)(fVar3 * (float)(int)(iVar13 + (uint)pIVar14->Y + 0x40)
                                            + fVar3 * (float)(int)(iVar13 + 0x41 + (uint)pIVar14->Y)
                                            )),0x10);
      auVar24 = vinsertps_avx(auVar25,SUB6416(ZEXT464(0x3f000000),0),0x10);
      auVar24 = vinsertps_avx(auVar24,auVar26,0x20);
      auVar24 = vinsertps_avx(auVar24,SUB6416(ZEXT464(0x3f000000),0),0x30);
      pfVar2 = &local_48->TexUvLines[0].x + local_60;
      *pfVar2 = auVar12._0_4_ * auVar24._0_4_;
      pfVar2[1] = auVar12._4_4_ * auVar24._4_4_;
      pfVar2[2] = auVar12._0_4_ * auVar24._8_4_;
      pfVar2[3] = auVar12._4_4_ * auVar24._12_4_;
      uVar15 = (ulong)((int)local_38 - 1);
      iVar20 = iVar20 + 1;
      local_60 = local_60 + 4;
      lVar22 = lVar22 + 1;
      atlas = local_48;
    } while (lVar22 != 0);
  }
  if (0 < (atlas->CustomRects).Size) {
    lVar22 = 0;
    lVar21 = 0;
    do {
      pIVar14 = (atlas->CustomRects).Data;
      lVar10 = *(long *)((long)&pIVar14->Font + lVar22);
      if ((lVar10 != 0) && (*(int *)((long)&pIVar14->GlyphID + lVar22) != 0)) {
        if (*(ImFontAtlas **)(lVar10 + 0x40) != atlas) {
          __assert_fail("r->Font->ContainerAtlas == atlas",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                        ,0xa29,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
        }
        local_50.x = 0.0;
        local_50.y = 0.0;
        local_58.x = 0.0;
        local_58.y = 0.0;
        ImFontAtlas::CalcCustomRectUV
                  (atlas,(ImFontAtlasCustomRect *)((long)&pIVar14->Width + lVar22),&local_50,
                   &local_58);
        fVar3 = *(float *)((long)&(pIVar14->GlyphOffset).x + lVar22);
        y0 = *(float *)((long)&(pIVar14->GlyphOffset).y + lVar22);
        ImFont::AddGlyph(*(ImFont **)((long)&pIVar14->Font + lVar22),(ImFontConfig *)0x0,
                         *(ImWchar *)((long)&pIVar14->GlyphID + lVar22),fVar3,y0,
                         fVar3 + (float)*(ushort *)((long)&pIVar14->Width + lVar22),
                         y0 + (float)*(ushort *)((long)&pIVar14->Height + lVar22),local_50.x,
                         local_50.y,local_58.x,local_58.y,
                         *(float *)((long)&pIVar14->GlyphAdvanceX + lVar22));
      }
      lVar21 = lVar21 + 1;
      lVar22 = lVar22 + 0x20;
    } while (lVar21 < (atlas->CustomRects).Size);
  }
  uVar16 = (atlas->Fonts).Size;
  if (0 < (int)uVar16) {
    lVar22 = 0;
    do {
      pIVar11 = (atlas->Fonts).Data[lVar22];
      if (pIVar11->DirtyLookupTables == true) {
        ImFont::BuildLookupTable(pIVar11);
      }
      lVar22 = lVar22 + 1;
      uVar16 = (atlas->Fonts).Size;
    } while (lVar22 < (int)uVar16);
  }
  if (0 < (int)uVar16) {
    uVar15 = 0;
    do {
      if ((long)(atlas->Fonts).Size <= (long)uVar15) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.h"
                      ,0x66a,"T &ImVector<ImFont *>::operator[](int) [T = ImFont *]");
      }
      pIVar11 = (atlas->Fonts).Data[uVar15];
      if (pIVar11->EllipsisChar == 0xffff) {
        lVar22 = 0;
        do {
          uVar5 = *(ushort *)((long)&DAT_001ed8c0 + lVar22);
          if ((((ulong)uVar5 < (ulong)(long)(pIVar11->IndexLookup).Size) &&
              ((pIVar11->IndexLookup).Data[uVar5] != 0xffff)) &&
             ((pIVar11->Glyphs).Data != (ImFontGlyph *)0x0)) {
            pIVar11->EllipsisChar = uVar5;
            break;
          }
          lVar22 = lVar22 + 2;
        } while (lVar22 == 2);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != uVar16);
  }
  return;
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data blocks
    IM_ASSERT(atlas->TexPixelsAlpha8 != NULL || atlas->TexPixelsRGBA32 != NULL);
    ImFontAtlasBuildRenderDefaultTexData(atlas);
    ImFontAtlasBuildRenderLinesTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlasCustomRect* r = &atlas->CustomRects[i];
        if (r->Font == NULL || r->GlyphID == 0)
            continue;

        // Will ignore ImFontConfig settings: GlyphMinAdvanceX, GlyphMinAdvanceY, GlyphExtraSpacing, PixelSnapH
        IM_ASSERT(r->Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(r, &uv0, &uv1);
        r->Font->AddGlyph(NULL, (ImWchar)r->GlyphID, r->GlyphOffset.x, r->GlyphOffset.y, r->GlyphOffset.x + r->Width, r->GlyphOffset.y + r->Height, uv0.x, uv0.y, uv1.x, uv1.y, r->GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (int i = 0; i < atlas->Fonts.Size; i++)
        if (atlas->Fonts[i]->DirtyLookupTables)
            atlas->Fonts[i]->BuildLookupTable();

    // Ellipsis character is required for rendering elided text. We prefer using U+2026 (horizontal ellipsis).
    // However some old fonts may contain ellipsis at U+0085. Here we auto-detect most suitable ellipsis character.
    // FIXME: Also note that 0x2026 is currently seldom included in our font ranges. Because of this we are more likely to use three individual dots.
    for (int i = 0; i < atlas->Fonts.size(); i++)
    {
        ImFont* font = atlas->Fonts[i];
        if (font->EllipsisChar != (ImWchar)-1)
            continue;
        const ImWchar ellipsis_variants[] = { (ImWchar)0x2026, (ImWchar)0x0085 };
        for (int j = 0; j < IM_ARRAYSIZE(ellipsis_variants); j++)
            if (font->FindGlyphNoFallback(ellipsis_variants[j]) != NULL) // Verify glyph exists
            {
                font->EllipsisChar = ellipsis_variants[j];
                break;
            }
    }
}